

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  ssize_t ws;
  uchar *p;
  _7zip_conflict *zip;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  piVar2 = (int *)a->format_data;
  ws = (ssize_t)buff;
  zip = (_7zip_conflict *)s;
  if (*piVar2 == -1) {
    piVar2[2] = 0;
    piVar2[3] = 0;
    iVar1 = __archive_mktemp((char *)0x0);
    *piVar2 = iVar1;
    if (*piVar2 < 0) {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"Couldn\'t create temporary file");
      return -0x1e;
    }
  }
  while( true ) {
    if (zip == (_7zip_conflict *)0x0) {
      return 0;
    }
    sVar3 = write(*piVar2,(void *)ws,(size_t)zip);
    if (sVar3 < 0) break;
    zip = (_7zip_conflict *)((long)zip - sVar3);
    ws = sVar3 + ws;
    *(ssize_t *)(piVar2 + 2) = sVar3 + *(long *)(piVar2 + 2);
  }
  piVar2 = __errno_location();
  archive_set_error(&a->archive,*piVar2,"fwrite function failed");
  return -0x1e;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	const unsigned char *p;
	ssize_t ws;

	xar = (struct xar *)a->format_data;
	p = (const unsigned char *)buff;
	while (s) {
		ws = write(xar->temp_fd, p, s);
		if (ws < 0) {
			archive_set_error(&(a->archive), errno,
			    "fwrite function failed");
			return (ARCHIVE_FATAL);
		}
		s -= ws;
		p += ws;
		xar->temp_offset += ws;
	}
	return (ARCHIVE_OK);
}